

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeCmdConvertPtr(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  CodeGenRegVmContext *ctx_local;
  RegVmCmd cmd_local;
  
  ctx->vmState->convertPtrWrap = ConvertPtrWrap;
  EMIT_OP_REG_NUM64(&ctx->ctx,o_mov64,rEDI,(unsigned_long_long)ctx->vmState);
  EMIT_OP_RPTR_NUM(&ctx->ctx,o_mov,sDWORD,rEDI,((int)ctx->vmState + 0x168) - (int)ctx->vmState,
                   ctx->currInstructionPos);
  ctx_local._4_4_ = cmd.argument;
  EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rESI,ctx_local._4_4_);
  ctx_local._2_1_ = cmd.rB;
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEDX,sDWORD,rEBX,(uint)ctx_local._2_1_ << 3);
  EMIT_REG_READ(&ctx->ctx,rESI);
  EMIT_REG_READ(&ctx->ctx,rEDX);
  EMIT_OP_RPTR(&ctx->ctx,o_call,sQWORD,rEDI,((int)ctx->vmState + 0xe0) - (int)ctx->vmState);
  ctx_local._3_1_ = cmd.rC;
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rEBX,(uint)ctx_local._3_1_ << 3);
  ctx_local._1_1_ = cmd.rA;
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBX,(uint)ctx_local._1_1_ << 3,rEAX);
  return;
}

Assistant:

void GenCodeCmdConvertPtr(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{

	ctx.vmState->convertPtrWrap = ConvertPtrWrap;

#if defined(_M_X64)
	EMIT_OP_REG_NUM64(ctx.ctx, o_mov64, rArg1, uintptr_t(ctx.vmState));
	EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rArg1, unsigned(uintptr_t(&ctx.vmState->callInstructionPos) - uintptr_t(ctx.vmState)), ctx.currInstructionPos);
	EMIT_OP_REG_NUM(ctx.ctx, o_mov, rArg2, cmd.argument);
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rArg3, sDWORD, rREG, cmd.rB * 8); // Load typeid
	EMIT_REG_READ(ctx.ctx, rArg2);
	EMIT_REG_READ(ctx.ctx, rArg3);
	EMIT_OP_RPTR(ctx.ctx, o_call, sQWORD, rArg1, unsigned(uintptr_t(&ctx.vmState->convertPtrWrap) - uintptr_t(ctx.vmState)));

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rREG, cmd.rC * 8); // Get source pointer
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, cmd.rA * 8, rRAX); // Move to target
#else
	EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, uintptr_t(&ctx.vmState->callInstructionPos), ctx.currInstructionPos);
	EMIT_OP_RPTR(ctx.ctx, o_push, sDWORD, rREG, cmd.rB * 8); // Source typeid
	EMIT_OP_NUM(ctx.ctx, o_push, cmd.argument); // Target typeid
	EMIT_OP_NUM(ctx.ctx, o_push, uintptr_t(ctx.vmState));
	EMIT_OP_ADDR(ctx.ctx, o_call, sDWORD, uintptr_t(&ctx.vmState->convertPtrWrap));
	EMIT_OP_REG_NUM(ctx.ctx, o_add, rESP, 12);

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rC * 8); // Get source pointer
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rEAX); // Move to target
#endif
}